

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

void AGSSock::Socket_Close(Socket *sock)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  fd_set *__arr;
  undefined1 auStack_a0 [4];
  uint __i;
  timeval timeout;
  fd_set read;
  Socket *sock_local;
  
  if (sock->type == 1) {
    shutdown(sock->id,1);
    _auStack_a0 = 0;
    timeout.tv_sec = 500;
    for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
      read.fds_bits[(ulong)__arr._4_4_ - 1] = 0;
    }
    lVar2 = (long)(sock->id / 0x40);
    read.fds_bits[lVar2 + -1] =
         1L << ((byte)((long)sock->id % 0x40) & 0x3f) | read.fds_bits[lVar2 + -1];
    iVar1 = select(sock->id + 1,(fd_set *)&timeout.tv_usec,(fd_set *)0x0,(fd_set *)0x0,
                   (timeval *)auStack_a0);
    if (0 < iVar1) {
      return;
    }
  }
  Pool::remove(pool,(char *)sock);
  close(sock->id);
  sock->id = -1;
  piVar3 = __errno_location();
  sock->error = *piVar3;
  return;
}

Assistant:

void Socket_Close(Socket *sock)
{
	if (sock->type == SOCK_STREAM)
	{
		// Graceful shutdown, the poolthread will detect if it succeeded.
		shutdown(sock->id, SD_SEND);
		
		// Wait for a response to prevent race conditions
		fd_set read;
		timeval timeout = {0, 500}; // Half a second fudge time
		FD_ZERO(&read);
		
		FD_SET(sock->id, &read);
		if (select(sock->id + 1, &read, nullptr, nullptr, &timeout) > 0)
			return;
			
		// Select failed or timeout: we force close
	}
	
	// Invalidate socket
	pool->remove(sock);
	closesocket(sock->id);
	sock->id = INVALID_SOCKET;
	sock->error = GET_ERROR();
}